

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expected.hpp
# Opt level: O3

void __thiscall
nonstd::expected_lite::
expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::~expected(expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *this)

{
  long *plVar1;
  pointer *ppuVar2;
  
  plVar1 = (long *)(this->contained).
                   super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .field_0.m_value.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
  if ((this->contained).
      super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value == true) {
    if (plVar1 != (long *)0x0) {
      operator_delete(plVar1,(long)(this->contained).
                                   super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   .field_0.m_value.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)plVar1
                     );
      return;
    }
  }
  else {
    ppuVar2 = &(this->contained).
               super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .field_0.m_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    if ((pointer *)plVar1 != ppuVar2) {
      operator_delete(plVar1,(ulong)(*ppuVar2 + 1));
      return;
    }
  }
  return;
}

Assistant:

~expected()
    {
        if ( has_value() ) contained.destruct_value();
        else               contained.destruct_error();
    }